

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O0

void decode_minimalExampleBadChecksum_isUnsuccessful(void)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_a8 [8];
  DecodedResult decodedResult;
  string local_60 [8];
  string expectedHrp;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string bstr;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,"a1lqfn3q",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"a",
             (allocator<char> *)
             ((long)&decodedResult.dp.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&decodedResult.dp.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bech32::decode((DecodedResult *)local_a8,(string *)local_28);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __assert_fail("decodedResult.hrp.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                  ,0x3b,"void decode_minimalExampleBadChecksum_isUnsuccessful()");
  }
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&decodedResult.hrp.field_2 + 8));
  if (!bVar1) {
    __assert_fail("decodedResult.dp.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                  ,0x3c,"void decode_minimalExampleBadChecksum_isUnsuccessful()");
  }
  bech32::DecodedResult::~DecodedResult((DecodedResult *)local_a8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void decode_minimalExampleBadChecksum_isUnsuccessful() {
    std::string bstr = "a1lqfn3q"; // last 'q' should be a 'a'
    std::string expectedHrp = "a";

    bech32::DecodedResult decodedResult = bech32::decode(bstr);

    assert(decodedResult.hrp.empty());
    assert(decodedResult.dp.empty());
}